

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3MaterializeView(Parse *pParse,Table *pView,Expr *pWhere,int iCur)

{
  byte *pbVar1;
  sqlite3 *db;
  int iVar2;
  Expr *pWhere_00;
  SrcList *pSrc;
  char *pcVar3;
  Select *p;
  SelectDest dest;
  SelectDest local_40;
  
  db = pParse->db;
  iVar2 = sqlite3SchemaToIndex(db,pView->pSchema);
  pWhere_00 = sqlite3ExprDup(db,pWhere,0);
  pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
  if (pSrc != (SrcList *)0x0) {
    pcVar3 = sqlite3DbStrDup(db,pView->zName);
    pSrc->a[0].zName = pcVar3;
    pcVar3 = sqlite3DbStrDup(db,db->aDb[iVar2].zName);
    pSrc->a[0].zDatabase = pcVar3;
  }
  p = sqlite3SelectNew(pParse,(ExprList *)0x0,pSrc,pWhere_00,(ExprList *)0x0,(Expr *)0x0,
                       (ExprList *)0x0,0,(Expr *)0x0,(Expr *)0x0);
  if (p != (Select *)0x0) {
    pbVar1 = (byte *)((long)&p->selFlags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  local_40.eDest = '\t';
  local_40.affSdst = '\0';
  local_40.iSdst = 0;
  local_40.nSdst = 0;
  local_40.iSDParm = iCur;
  sqlite3Select(pParse,p,&local_40);
  sqlite3SelectDelete(db,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MaterializeView(
  Parse *pParse,       /* Parsing context */
  Table *pView,        /* View definition */
  Expr *pWhere,        /* Optional WHERE clause to be added */
  int iCur             /* Cursor number for ephemerial table */
){
  SelectDest dest;
  Select *pSel;
  SrcList *pFrom;
  sqlite3 *db = pParse->db;
  int iDb = sqlite3SchemaToIndex(db, pView->pSchema);

  pWhere = sqlite3ExprDup(db, pWhere, 0);
  pFrom = sqlite3SrcListAppend(db, 0, 0, 0);

  if( pFrom ){
    assert( pFrom->nSrc==1 );
    pFrom->a[0].zName = sqlite3DbStrDup(db, pView->zName);
    pFrom->a[0].zDatabase = sqlite3DbStrDup(db, db->aDb[iDb].zName);
    assert( pFrom->a[0].pOn==0 );
    assert( pFrom->a[0].pUsing==0 );
  }

  pSel = sqlite3SelectNew(pParse, 0, pFrom, pWhere, 0, 0, 0, 0, 0, 0);
  if( pSel ) pSel->selFlags |= SF_Materialize;

  sqlite3SelectDestInit(&dest, SRT_EphemTab, iCur);
  sqlite3Select(pParse, pSel, &dest);
  sqlite3SelectDelete(db, pSel);
}